

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::OptionalFilter::Copy(OptionalFilter *this)

{
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  pointer pTVar3;
  pointer pOVar4;
  long in_RSI;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_20;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_18;
  
  make_uniq<duckdb::OptionalFilter>();
  pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                       *)(in_RSI + 0x10));
  (*pTVar3->_vptr_TableFilter[4])(&local_20,pTVar3);
  pOVar4 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>::
           operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                       *)&local_18);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (TableFilter *)0x0;
  _Var1._M_head_impl =
       (pOVar4->child_filter).
       super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
       super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  (pOVar4->child_filter).
  super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (TableFilter *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableFilter + 8))();
    if (local_20._M_head_impl != (TableFilter *)0x0) {
      (*(local_20._M_head_impl)->_vptr_TableFilter[1])();
    }
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)local_18._M_head_impl;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> OptionalFilter::Copy() const {
	auto copy = make_uniq<OptionalFilter>();
	copy->child_filter = child_filter->Copy();
	return duckdb::unique_ptr_cast<OptionalFilter, TableFilter>(std::move(copy));
}